

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool do_frint_mode(DisasContext_conflict1 *s,arg_rpr_esz *a,int mode)

{
  TCGTemp *ts;
  int iVar1;
  uint32_t oprsz;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var2;
  TCGv_i32 pTVar3;
  TCGv_ptr ptr;
  uintptr_t o;
  TCGTemp *ret;
  TCGTemp *args [2];
  
  iVar1 = a->esz;
  if (iVar1 != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    _Var2 = sve_access_check_aarch64(s);
    if (_Var2) {
      oprsz = s->sve_len;
      pTVar3 = tcg_const_i32_aarch64(tcg_ctx,mode);
      ptr = get_fpstatus_ptr_aarch64(tcg_ctx,a->esz == 1);
      ret = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
      ts = (TCGTemp *)(ptr + (long)&tcg_ctx->pool_cur);
      args[0] = ret;
      args[1] = ts;
      tcg_gen_callN_aarch64(tcg_ctx,helper_set_rmode_aarch64,ret,2,args);
      tcg_gen_gvec_3_ptr_aarch64
                (tcg_ctx,a->rd * 0x100 + 0xc10,a->rn * 0x100 + 0xc10,a->pg * 0x20 + 0x2c10,ptr,oprsz
                 ,oprsz,0,trans_FCMLA_zzxz::fns[(long)a->esz + 1]);
      args[0] = ret;
      args[1] = ts;
      tcg_gen_callN_aarch64(tcg_ctx,helper_set_rmode_aarch64,ret,2,args);
      tcg_temp_free_internal_aarch64(tcg_ctx,ret);
      tcg_temp_free_internal_aarch64(tcg_ctx,ts);
    }
  }
  return iVar1 != 0;
}

Assistant:

static bool do_frint_mode(DisasContext *s, arg_rpr_esz *a, int mode)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz == 0) {
        return false;
    }
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        TCGv_i32 tmode = tcg_const_i32(tcg_ctx, mode);
        TCGv_ptr status = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);

        gen_helper_set_rmode(tcg_ctx, tmode, tmode, status);

        tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           pred_full_reg_offset(s, a->pg),
                           status, vsz, vsz, 0, frint_fns[a->esz - 1]);

        gen_helper_set_rmode(tcg_ctx, tmode, tmode, status);
        tcg_temp_free_i32(tcg_ctx, tmode);
        tcg_temp_free_ptr(tcg_ctx, status);
    }
    return true;
}